

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O2

int HammeringPattern::get_num_digits(size_t x)

{
  int iVar1;
  
  if (x < 10) {
    iVar1 = 1;
  }
  else if (x < 100) {
    iVar1 = 2;
  }
  else if (x < 1000) {
    iVar1 = 3;
  }
  else if (x < 10000) {
    iVar1 = 4;
  }
  else if (x < 100000) {
    iVar1 = 5;
  }
  else if (x < 1000000) {
    iVar1 = 6;
  }
  else if (x < 10000000) {
    iVar1 = 7;
  }
  else if (x < 100000000) {
    iVar1 = 8;
  }
  else {
    iVar1 = 10 - (uint)(x < 1000000000);
  }
  return iVar1;
}

Assistant:

int HammeringPattern::get_num_digits(size_t x) {
  return (x < 10 ? 1 :
          (x < 100 ? 2 :
           (x < 1000 ? 3 :
            (x < 10000 ? 4 :
             (x < 100000 ? 5 :
              (x < 1000000 ? 6 :
               (x < 10000000 ? 7 :
              (x < 100000000 ? 8 :
                 (x < 1000000000 ? 9 : 10)))))))));
}